

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

EmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitSetLocal(WasmBytecodeGenerator *this,bool tee)

{
  uint uVar1;
  IWasmByteCodeWriter *pIVar2;
  OpCodeAsmJs OVar3;
  uint32 uVar4;
  WasmReaderBase *pWVar5;
  WasmCompilationException *this_00;
  EmitInfo local_3c;
  EmitInfo info;
  WasmLocal local;
  uint32 localNum;
  bool tee_local;
  WasmBytecodeGenerator *this_local;
  
  pWVar5 = GetReader(this);
  uVar1 = (pWVar5->m_currentNode).field_1.brTable.numTargets;
  uVar4 = WasmFunctionInfo::GetLocalCount(this->m_funcInfo);
  if (uVar4 <= uVar1) {
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_00,L"%u is not a valid local",(ulong)uVar1);
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  info = *(EmitInfo *)(this->m_locals + uVar1);
  local_3c = PopEvalStack(this,info.type,(char16 *)0x0);
  pIVar2 = this->m_writer;
  OVar3 = GetLoadOp(this,info.type);
  (*pIVar2->_vptr_IWasmByteCodeWriter[0xf])
            (pIVar2,(ulong)OVar3,(ulong)info & 0xffffffff,(ulong)local_3c & 0xffffffff);
  if (tee) {
    if (local_3c.type == Any) {
      local_3c = info;
    }
    this_local = (WasmBytecodeGenerator *)local_3c;
  }
  else {
    ReleaseLocation(this,&local_3c);
    EmitInfo::EmitInfo((EmitInfo *)&this_local);
  }
  return (EmitInfo)this_local;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitSetLocal(bool tee)
{
    uint32 localNum = GetReader()->m_currentNode.var.num;
    if (localNum >= m_funcInfo->GetLocalCount())
    {
        throw WasmCompilationException(_u("%u is not a valid local"), localNum);
    }

    WasmLocal local = m_locals[localNum];

    EmitInfo info = PopEvalStack(local.type);

    m_writer->AsmReg2(GetLoadOp(local.type), local.location, info.location);

    if (tee)
    {
        if (info.type == WasmTypes::Any)
        {
            info.location = local.location;
            info.type = local.type;
        }
        return info;
    }
    else
    {
        ReleaseLocation(&info);
        return EmitInfo();
    }
}